

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

SiameseResult __thiscall siamese::Decoder::Get(Decoder *this,SiameseOriginalPacket *packetOut)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  int *in_RSI;
  size_type in_RDI;
  uint length;
  uint headerBytes;
  OriginalPacket *original;
  uint element;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SiameseResult local_48;
  
  if ((*(byte *)(in_RDI + 0x8f0) & 1) == 0) {
    if ((*in_RSI - *(int *)(in_RDI + 0x2b4) & 0x3fffffU) < *(uint *)(in_RDI + 0x2b0)) {
      pvVar3 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                         ((array<siamese::OriginalPacket,_64UL> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
      if ((pvVar3->Buffer).Bytes == 0) {
        in_RSI[2] = 0;
        in_RSI[3] = 0;
        in_RSI[1] = 0;
        local_48 = Siamese_NeedMoreData;
      }
      else {
        uVar1 = pvVar3->HeaderBytes;
        uVar2 = (pvVar3->Buffer).Bytes;
        *(uint8_t **)(in_RSI + 2) = (pvVar3->Buffer).Data + uVar1;
        in_RSI[1] = uVar2 - uVar1;
        local_48 = Siamese_Success;
      }
    }
    else {
      in_RSI[2] = 0;
      in_RSI[3] = 0;
      in_RSI[1] = 0;
      local_48 = Siamese_NeedMoreData;
    }
  }
  else {
    local_48 = Siamese_Disabled;
  }
  return local_48;
}

Assistant:

SiameseResult Decoder::Get(SiameseOriginalPacket& packetOut)
{
    // Note: Keep this in sync with Encoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    const unsigned element = Window.ColumnToElement(packetOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    const unsigned headerBytes = original->HeaderBytes;
    SIAMESE_DEBUG_ASSERT(headerBytes > 0 && original->Buffer.Bytes > headerBytes);
    const unsigned length = original->Buffer.Bytes - headerBytes;

#ifdef SIAMESE_DEBUG
    // Check: Deserialize length from the front
    unsigned lengthCheck;
    int headerBytesCheck = DeserializeHeader_PacketLength(
        original->Buffer.Data,
        original->Buffer.Bytes,
        lengthCheck);

    if (lengthCheck != length || (int)headerBytes != headerBytesCheck ||
        headerBytesCheck < 1 || lengthCheck == 0 ||
        lengthCheck + headerBytesCheck != original->Buffer.Bytes)
    {
        SIAMESE_DEBUG_BREAK(); // Invalid input
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }
#endif // SIAMESE_DEBUG

    packetOut.Data      = original->Buffer.Data + headerBytes;
    packetOut.DataBytes = length;
    return Siamese_Success;
}